

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O0

word Shr_ManComputeTruth6_rec(Gia_Man_t *p,int iNode,Vec_Wrd_t *vTruths)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  ulong local_40;
  word Truth1;
  word Truth0;
  Gia_Obj_t *pObj;
  Vec_Wrd_t *vTruths_local;
  int iNode_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iNode);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iNode);
    pObj_00 = Gia_ManObj(p,iNode);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                    ,0x145,"word Shr_ManComputeTruth6_rec(Gia_Man_t *, int, Vec_Wrd_t *)");
    }
    iVar1 = Gia_ObjFaninId0p(p,pObj_00);
    Truth1 = Shr_ManComputeTruth6_rec(p,iVar1,vTruths);
    iVar1 = Gia_ObjFaninId1p(p,pObj_00);
    local_40 = Shr_ManComputeTruth6_rec(p,iVar1,vTruths);
    iVar1 = Gia_ObjFaninC0(pObj_00);
    if (iVar1 != 0) {
      Truth1 = Truth1 ^ 0xffffffffffffffff;
    }
    iVar1 = Gia_ObjFaninC1(pObj_00);
    if (iVar1 != 0) {
      local_40 = local_40 ^ 0xffffffffffffffff;
    }
    Vec_WrdWriteEntry(vTruths,iNode,Truth1 & local_40);
    p_local = (Gia_Man_t *)(Truth1 & local_40);
  }
  else {
    p_local = (Gia_Man_t *)Vec_WrdEntry(vTruths,iNode);
  }
  return (word)p_local;
}

Assistant:

word Shr_ManComputeTruth6_rec( Gia_Man_t * p, int iNode, Vec_Wrd_t * vTruths )
{
    Gia_Obj_t * pObj;
    word Truth0, Truth1;
    if ( Gia_ObjIsTravIdCurrentId(p, iNode) )
        return Vec_WrdEntry(vTruths, iNode);
    Gia_ObjSetTravIdCurrentId(p, iNode);
    pObj = Gia_ManObj( p, iNode );
    assert( Gia_ObjIsAnd(pObj) );
    Truth0 = Shr_ManComputeTruth6_rec( p, Gia_ObjFaninId0p(p, pObj), vTruths );
    Truth1 = Shr_ManComputeTruth6_rec( p, Gia_ObjFaninId1p(p, pObj), vTruths );
    if ( Gia_ObjFaninC0(pObj) )
        Truth0 = ~Truth0;
    if ( Gia_ObjFaninC1(pObj) )
        Truth1 = ~Truth1;
    Vec_WrdWriteEntry( vTruths, iNode, Truth0 & Truth1 );
    return Truth0 & Truth1;
}